

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O0

size_t __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::Check(SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
        *this,bool checkCount)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *in_R8;
  size_t smallHeapBlockCount;
  bool checkCount_local;
  SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  sVar3 = HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          ::Check(&this->
                   super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                  ,false);
  if (this->partialHeapBlockList !=
      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
    if ((pRVar4->inPartialCollectMode & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2de,
                         "(partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  sVar6 = HeapInfo::
          Check<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                    ((HeapInfo *)0x0,false,SUB81(this->partialHeapBlockList,0),
                     (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                     in_R8);
  if (this->partialSweptHeapBlockList !=
      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pRVar4 = HeapBucket::GetRecycler((HeapBucket *)this);
    if ((pRVar4->inPartialCollectMode & 1U) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x2e2,
                         "(partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode)"
                         ,
                         "partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  sVar7 = HeapInfo::
          Check<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                    ((HeapInfo *)0x0,false,SUB81(this->partialSweptHeapBlockList,0),
                     (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0,
                     in_R8);
  uVar8 = sVar7 + sVar6 + sVar3;
  if ((checkCount) &&
     ((this->
      super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
      ).super_HeapBucket.heapBlockCount != uVar8)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x2e6,"(!checkCount || this->heapBlockCount == smallHeapBlockCount)",
                       "!checkCount || this->heapBlockCount == smallHeapBlockCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return uVar8;
}

Assistant:

size_t
SmallNormalHeapBucketBase<TBlockType>::Check(bool checkCount)
{
    size_t smallHeapBlockCount = __super::Check(false);
    Assert(partialHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    smallHeapBlockCount += HeapInfo::Check(false, false, this->partialHeapBlockList);

#if ENABLE_CONCURRENT_GC
    Assert(partialSweptHeapBlockList == nullptr || this->GetRecycler()->inPartialCollectMode);
    smallHeapBlockCount += HeapInfo::Check(false, false, this->partialSweptHeapBlockList);
#endif

    Assert(!checkCount || this->heapBlockCount == smallHeapBlockCount);
    return smallHeapBlockCount;
}